

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

void __thiscall Fl_Table::col_position(Fl_Table *this,int col)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double local_20;
  double newleft;
  int col_local;
  Fl_Table *this_local;
  
  if (this->_col_position != col) {
    if (col < 0) {
      newleft._4_4_ = 0;
    }
    else {
      iVar1 = cols(this);
      newleft._4_4_ = col;
      if (iVar1 <= col) {
        iVar1 = cols(this);
        newleft._4_4_ = iVar1 + -1;
      }
    }
    if (this->tiw < this->table_w) {
      lVar2 = col_scroll_position(this,newleft._4_4_);
      local_20 = (double)lVar2;
      dVar3 = Fl_Valuator::maximum((Fl_Valuator *)this->hscrollbar);
      if (dVar3 < local_20) {
        local_20 = Fl_Valuator::maximum((Fl_Valuator *)this->hscrollbar);
      }
      Fl_Valuator::value((Fl_Valuator *)this->hscrollbar,local_20);
      table_scrolled(this);
      Fl_Widget::redraw((Fl_Widget *)this);
      this->_col_position = newleft._4_4_;
    }
  }
  return;
}

Assistant:

void Fl_Table::col_position(int col) {
  if ( _col_position == col ) return;	// OPTIMIZATION: no change? avoid redraw
  if ( col < 0 ) col = 0;
  else if ( col >= cols() ) col = cols() - 1;
  if ( table_w <= tiw ) return;		// don't scroll if table smaller than window
  double newleft = col_scroll_position(col);
  if ( newleft > hscrollbar->maximum() ) {
    newleft = hscrollbar->maximum();
  }
  hscrollbar->Fl_Slider::value(newleft);
  table_scrolled();
  redraw();
  _col_position = col;	// HACK: override what table_scrolled() came up with
}